

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O1

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxRigidBody[]>(mmd *this,size_t n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  size_t *psVar4;
  size_t *psVar5;
  long lVar6;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar2 = SUB168(auVar1 * ZEXT816(0x88),0);
  uVar3 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar2 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x88),8) == 0) {
    uVar2 = uVar3;
  }
  psVar4 = (size_t *)operator_new__(uVar2);
  *psVar4 = n;
  if (n != 0) {
    psVar5 = psVar4 + 7;
    lVar6 = n * 0x88;
    do {
      psVar5[-6] = (size_t)(psVar5 + -4);
      psVar5[-5] = 0;
      *(undefined1 *)(psVar5 + -4) = 0;
      psVar5[-2] = (size_t)psVar5;
      psVar5[-1] = 0;
      *(undefined1 *)psVar5 = 0;
      *(undefined4 *)(psVar5 + 2) = 0;
      *(undefined1 *)((long)psVar5 + 0x14) = 0;
      *(undefined2 *)((long)psVar5 + 0x16) = 0;
      *(undefined1 *)(psVar5 + 3) = 0;
      *(undefined8 *)((long)psVar5 + 0x1c) = 0;
      *(undefined8 *)((long)psVar5 + 0x24) = 0;
      *(undefined8 *)((long)psVar5 + 0x2c) = 0;
      *(undefined8 *)((long)psVar5 + 0x34) = 0;
      *(undefined8 *)((long)psVar5 + 0x3c) = 0;
      *(undefined8 *)((long)psVar5 + 0x44) = 0;
      *(undefined8 *)((long)psVar5 + 0x45) = 0;
      *(undefined8 *)((long)psVar5 + 0x4d) = 0;
      psVar5 = psVar5 + 0x11;
      lVar6 = lVar6 + -0x88;
    } while (lVar6 != 0);
  }
  *(size_t **)this = psVar4 + 1;
  return (__uniq_ptr_data<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>,_true,_true>)
         (__uniq_ptr_data<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>,_true,_true>)
         this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }